

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mac_simple.c
# Opt level: O0

void mac_simple(ssh2_macalg *alg,ptrlen key,ptrlen data,void *output)

{
  ssh2_mac *m;
  ssh2_mac *mac;
  void *output_local;
  ssh2_macalg *alg_local;
  ptrlen data_local;
  ptrlen key_local;
  
  m = ssh2_mac_new(alg,(ssh_cipher *)0x0);
  ssh2_mac_setkey(m,key);
  ssh2_mac_start(m);
  BinarySink_put_datapl(m->binarysink_,data);
  ssh2_mac_genresult(m,(uchar *)output);
  ssh2_mac_free(m);
  return;
}

Assistant:

void mac_simple(const ssh2_macalg *alg, ptrlen key, ptrlen data, void *output)
{
    ssh2_mac *mac = ssh2_mac_new(alg, NULL);
    ssh2_mac_setkey(mac, key);
    ssh2_mac_start(mac);
    put_datapl(mac, data);
    ssh2_mac_genresult(mac, output);
    ssh2_mac_free(mac);
}